

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

double __thiscall despot::QNode::Weight(QNode *this)

{
  _Base_ptr p_Var1;
  _Self __tmp;
  double dVar2;
  double local_18;
  
  p_Var1 = (this->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_18 = 0.0;
  for (; (_Rb_tree_header *)p_Var1 != &(this->children_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    dVar2 = State::Weight((vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                          p_Var1[1]._M_parent);
    local_18 = local_18 + dVar2;
  }
  return local_18;
}

Assistant:

double QNode::Weight() const {
	double weight = 0;
	for (map<OBS_TYPE, VNode*>::const_iterator it = children_.begin();
		it != children_.end(); it++) {
		weight += it->second->Weight();
	}
	return weight;
}